

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

int __thiscall section_data::push_intercept(section_data *this,int *layer,intercept_data intercept)

{
  mapped_type *this_00;
  int *layer_local;
  section_data *this_local;
  undefined1 local_14 [8];
  intercept_data intercept_local;
  
  intercept_local.x = intercept.dist;
  local_14 = intercept._0_8_;
  this_00 = std::
            map<int,_std::vector<intercept_data,_std::allocator<intercept_data>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>_>_>
            ::operator[](&this->layer_intercepts,layer);
  std::vector<intercept_data,_std::allocator<intercept_data>_>::push_back
            (this_00,(value_type *)local_14);
  return 0;
}

Assistant:

int section_data::push_intercept(int &layer, intercept_data intercept)
{
  // map<int, vector<double>> layer_intercepts
  // key = layer number
  layer_intercepts[layer].push_back(intercept);
  return EXIT_SUCCESS;
}